

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::addEvent<std::array<int,6ul>>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,array<int,_6UL> *args)

{
  Queue *pQVar1;
  undefined8 uVar2;
  size_t sVar3;
  char *pcVar4;
  char *data;
  
  if ((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < 0x30) {
    sVar3 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw);
    if (((sVar3 < 0x30) &&
        (replaceChannel(this,0x30),
        (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < 0x30)) &&
       (sVar3 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw), sVar3 < 0x30)) {
      return false;
    }
  }
  pcVar4 = (this->_qw)._writePos;
  pcVar4[0] = ',';
  pcVar4[1] = '\0';
  pcVar4[2] = '\0';
  pcVar4[3] = '\0';
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 4;
  *(uint64_t *)(pcVar4 + 4) = eventSourceId;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 8;
  *(uint64_t *)(pcVar4 + 8) = clock;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 8;
  pcVar4[8] = '\x06';
  pcVar4[9] = '\0';
  pcVar4[10] = '\0';
  pcVar4[0xb] = '\0';
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 4;
  *(undefined8 *)(pcVar4 + 0x14) = *(undefined8 *)(args->_M_elems + 4);
  uVar2 = *(undefined8 *)(args->_M_elems + 2);
  *(undefined8 *)(pcVar4 + 4) = *(undefined8 *)args->_M_elems;
  *(undefined8 *)(pcVar4 + 0xc) = uVar2;
  pQVar1 = (this->_qw)._queue;
  pcVar4 = (this->_qw)._writePos + 0x18;
  (this->_qw)._writePos = pcVar4;
  (pQVar1->writeIndex).super___atomic_base<unsigned_long>._M_i = (long)pcVar4 - (long)pQVar1->buffer
  ;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}